

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O3

void __thiscall LFPConsumer::initialize(LFPConsumer *this)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  int i;
  vector<int,_std::allocator<int>_> newindices;
  int local_5c;
  vector<int,_std::allocator<int>_> local_58;
  int local_34;
  
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  piVar3 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar3 != piVar1) {
    local_5c = -2;
    do {
      iVar2 = *piVar3;
      if (iVar2 - local_5c == 1) {
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1] =
             local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish[-1] + 1;
        local_5c = iVar2;
      }
      else {
        if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          local_5c = iVar2;
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_58,
                     (iterator)
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_5c);
        }
        else {
          *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar2;
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
          local_5c = iVar2;
        }
        local_34 = 1;
        if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_58,
                     (iterator)
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_34);
        }
        else {
          *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = 1;
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      piVar3 = piVar3 + 1;
    } while (piVar3 != piVar1);
  }
  std::vector<int,_std::allocator<int>_>::operator=(&(this->args).indices,&local_58);
  iVar2 = HighFreqDataType::getByteSize(&(this->super_HFSubConsumer).super_HighFreqSub.dt);
  std::vector<short,_std::allocator<short>_>::resize(&this->temp,(ulong)(long)iVar2 >> 1);
  HFSubConsumer::initialize(&this->super_HFSubConsumer);
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LFPConsumer::initialize(){
    //indices are list of indices for each ntrode requested
    //Here, convert into {startbyte, len} so that nearby indices are collapsed
    std::vector<int> newindices;
    int prev = -2;
    for(auto const i : args.indices){
        if(i-prev == 1){//If i is right after the previous index
            newindices.back()++;
        }
        else{//else its a new separate grouping
            newindices.push_back(i);
            newindices.push_back(1);
        }
        prev = i;
    }
    // for(auto const i : newindices) std::cout << "-i" << i;
    // std::cout << std::endl;
    args.indices = newindices;
    // std::cout << std::endl;
    temp.resize(dt.getByteSize()/sizeof(int16_t));
    HFSubConsumer::initialize();
}